

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * __thiscall spirv_cross::CompilerGLSL::format_to_glsl(CompilerGLSL *this,ImageFormat format)

{
  bool bVar1;
  CompilerError *this_00;
  allocator local_41;
  string local_40 [36];
  ImageFormat local_1c;
  CompilerGLSL *pCStack_18;
  ImageFormat format_local;
  CompilerGLSL *this_local;
  
  local_1c = format;
  if ((((this->options).es & 1U) != 0) &&
     (pCStack_18 = this, bVar1 = Compiler::is_desktop_only_format(format), bVar1)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_40,"Attempting to use image format not supported in ES profile.",&local_41);
    CompilerError::CompilerError(this_00,(string *)local_40);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  switch(local_1c) {
  default:
    this_local = (CompilerGLSL *)0x0;
    break;
  case ImageFormatRgba32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5acf;
    break;
  case ImageFormatRgba16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5adb;
    break;
  case ImageFormatR32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f989;
    break;
  case ImageFormatRgba8:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f9b9;
    break;
  case ImageFormatRgba8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5aff;
    break;
  case ImageFormatRg32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5b0b;
    break;
  case ImageFormatRg16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f995;
    break;
  case ImageFormatR11fG11fB10f:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f97d;
    break;
  case ImageFormatR16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5bbf;
    break;
  case ImageFormatRgba16:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c07;
    break;
  case ImageFormatRgb10A2:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f9ad;
    break;
  case ImageFormatRg16:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f9a1;
    break;
  case ImageFormatRg8:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5be3;
    break;
  case ImageFormatR16:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5bef;
    break;
  case ImageFormatR8:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5bd7;
    break;
  case ImageFormatRgba16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c2b;
    break;
  case ImageFormatRg16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c1f;
    break;
  case ImageFormatRg8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c43;
    break;
  case ImageFormatR16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c13;
    break;
  case ImageFormatR8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c37;
    break;
  case ImageFormatRgba32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5b23;
    break;
  case ImageFormatRgba16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5b2f;
    break;
  case ImageFormatRgba8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f9c5;
    break;
  case ImageFormatR32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5b3b;
    break;
  case ImageFormatRg32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5b53;
    break;
  case ImageFormatRg16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f9dd;
    break;
  case ImageFormatRg8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c8b;
    break;
  case ImageFormatR16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c97;
    break;
  case ImageFormatR8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c7f;
    break;
  case ImageFormatRgba32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5b6b;
    break;
  case ImageFormatRgba16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5b77;
    break;
  case ImageFormatRgba8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f9d1;
    break;
  case ImageFormatR32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_2fa01;
    break;
  case ImageFormatRgb10a2ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f9e9;
    break;
  case ImageFormatRg32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5b9b;
    break;
  case ImageFormatRg16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_2f9f5;
    break;
  case ImageFormatRg8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c5b;
    break;
  case ImageFormatR16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c67;
    break;
  case ImageFormatR8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_b5c4f;
  }
  return (char *)this_local;
}

Assistant:

const char *CompilerGLSL::format_to_glsl(spv::ImageFormat format)
{
	if (options.es && is_desktop_only_format(format))
		SPIRV_CROSS_THROW("Attempting to use image format not supported in ES profile.");

	switch (format)
	{
	case ImageFormatRgba32f:
		return "rgba32f";
	case ImageFormatRgba16f:
		return "rgba16f";
	case ImageFormatR32f:
		return "r32f";
	case ImageFormatRgba8:
		return "rgba8";
	case ImageFormatRgba8Snorm:
		return "rgba8_snorm";
	case ImageFormatRg32f:
		return "rg32f";
	case ImageFormatRg16f:
		return "rg16f";
	case ImageFormatRgba32i:
		return "rgba32i";
	case ImageFormatRgba16i:
		return "rgba16i";
	case ImageFormatR32i:
		return "r32i";
	case ImageFormatRgba8i:
		return "rgba8i";
	case ImageFormatRg32i:
		return "rg32i";
	case ImageFormatRg16i:
		return "rg16i";
	case ImageFormatRgba32ui:
		return "rgba32ui";
	case ImageFormatRgba16ui:
		return "rgba16ui";
	case ImageFormatR32ui:
		return "r32ui";
	case ImageFormatRgba8ui:
		return "rgba8ui";
	case ImageFormatRg32ui:
		return "rg32ui";
	case ImageFormatRg16ui:
		return "rg16ui";
	case ImageFormatR11fG11fB10f:
		return "r11f_g11f_b10f";
	case ImageFormatR16f:
		return "r16f";
	case ImageFormatRgb10A2:
		return "rgb10_a2";
	case ImageFormatR8:
		return "r8";
	case ImageFormatRg8:
		return "rg8";
	case ImageFormatR16:
		return "r16";
	case ImageFormatRg16:
		return "rg16";
	case ImageFormatRgba16:
		return "rgba16";
	case ImageFormatR16Snorm:
		return "r16_snorm";
	case ImageFormatRg16Snorm:
		return "rg16_snorm";
	case ImageFormatRgba16Snorm:
		return "rgba16_snorm";
	case ImageFormatR8Snorm:
		return "r8_snorm";
	case ImageFormatRg8Snorm:
		return "rg8_snorm";
	case ImageFormatR8ui:
		return "r8ui";
	case ImageFormatRg8ui:
		return "rg8ui";
	case ImageFormatR16ui:
		return "r16ui";
	case ImageFormatRgb10a2ui:
		return "rgb10_a2ui";
	case ImageFormatR8i:
		return "r8i";
	case ImageFormatRg8i:
		return "rg8i";
	case ImageFormatR16i:
		return "r16i";
	default:
	case ImageFormatUnknown:
		return nullptr;
	}
}